

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int init_blocksize(vorb *f,int b,int n)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  uint16 *puVar4;
  int in_EDX;
  int in_ESI;
  vorb *in_RDI;
  int n8;
  int n4;
  int n2;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = in_EDX >> 1;
  iVar2 = in_EDX >> 3;
  pfVar3 = (float *)setup_malloc((vorb *)CONCAT44(in_ESI,in_EDX),iVar1);
  in_RDI->A[in_ESI] = pfVar3;
  pfVar3 = (float *)setup_malloc((vorb *)CONCAT44(in_ESI,in_EDX),iVar1);
  in_RDI->B[in_ESI] = pfVar3;
  pfVar3 = (float *)setup_malloc((vorb *)CONCAT44(in_ESI,in_EDX),iVar1);
  in_RDI->C[in_ESI] = pfVar3;
  if (((in_RDI->A[in_ESI] == (float *)0x0) || (in_RDI->B[in_ESI] == (float *)0x0)) ||
     (in_RDI->C[in_ESI] == (float *)0x0)) {
    iVar1 = error(in_RDI,VORBIS_outofmem);
  }
  else {
    compute_twiddle_factors
              (n8,(float *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (float *)in_RDI,(float *)CONCAT44(in_ESI,in_EDX));
    pfVar3 = (float *)setup_malloc((vorb *)CONCAT44(in_ESI,in_EDX),iVar1);
    in_RDI->window[in_ESI] = pfVar3;
    if (in_RDI->window[in_ESI] == (float *)0x0) {
      iVar1 = error(in_RDI,VORBIS_outofmem);
    }
    else {
      compute_window(iVar1,(float *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
      puVar4 = (uint16 *)setup_malloc((vorb *)CONCAT44(in_ESI,in_EDX),iVar1);
      in_RDI->bit_reverse[in_ESI] = puVar4;
      if (in_RDI->bit_reverse[in_ESI] == (uint16 *)0x0) {
        iVar1 = error(in_RDI,VORBIS_outofmem);
      }
      else {
        compute_bitreverse((int)((ulong)in_RDI >> 0x20),(uint16 *)CONCAT44(in_ESI,in_EDX));
        iVar1 = 1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int init_blocksize(vorb *f, int b, int n)
{
   int n2 = n >> 1, n4 = n >> 2, n8 = n >> 3;
   f->A[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->B[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->C[b] = (float *) setup_malloc(f, sizeof(float) * n4);
   if (!f->A[b] || !f->B[b] || !f->C[b]) return error(f, VORBIS_outofmem);
   compute_twiddle_factors(n, f->A[b], f->B[b], f->C[b]);
   f->window[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   if (!f->window[b]) return error(f, VORBIS_outofmem);
   compute_window(n, f->window[b]);
   f->bit_reverse[b] = (uint16 *) setup_malloc(f, sizeof(uint16) * n8);
   if (!f->bit_reverse[b]) return error(f, VORBIS_outofmem);
   compute_bitreverse(n, f->bit_reverse[b]);
   return TRUE;
}